

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O3

Abc_Ntk_t * Abc_SclPerformBuffering(Abc_Ntk_t *p,int DegreeR,int Degree,int fUseInvs,int fVerbose)

{
  int iVar1;
  Abc_Obj_t *pObj;
  bool bVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  ulong uVar4;
  Vec_Ptr_t *pVVar5;
  Abc_Ntk_t *p_01;
  ulong uVar6;
  int Fill;
  long lVar7;
  int iVar8;
  
  if (p->ntkFunc != ABC_FUNC_MAP) {
    __assert_fail("Abc_NtkHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclBuffer.c"
                  ,0x1d1,"Abc_Ntk_t *Abc_SclPerformBuffering(Abc_Ntk_t *, int, int, int, int)");
  }
  if ((fUseInvs != 0) &&
     (puts("Warning!!! Using inverters instead of buffers."), p->vPhases == (Vec_Int_t *)0x0)) {
    puts("The phases are not given. The result will not verify.");
  }
  pVVar5 = p->vCis;
  iVar1 = pVVar5->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar8 = iVar1;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar8;
  if (iVar8 == 0) {
    piVar3 = (int *)0x0;
  }
  else {
    piVar3 = (int *)malloc((long)iVar8 << 2);
  }
  p_00->pArray = piVar3;
  if (iVar1 < 1) {
    bVar2 = false;
  }
  else {
    lVar7 = 0;
    do {
      Vec_IntPush(p_00,*(uint *)((long)pVVar5->pArray[lVar7] + 0x14) >> 0xc);
      lVar7 = lVar7 + 1;
      pVVar5 = p->vCis;
    } while (lVar7 < pVVar5->nSize);
    bVar2 = 0 < pVVar5->nSize;
  }
  if ((p->vTravIds).pArray == (int *)0x0) {
    iVar1 = p->vObjs->nSize;
    uVar4 = (long)iVar1 + 500;
    iVar8 = (int)uVar4;
    if ((p->vTravIds).nCap < iVar8) {
      piVar3 = (int *)malloc(uVar4 * 4);
      (p->vTravIds).pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vTravIds).nCap = iVar8;
    }
    else {
      piVar3 = (int *)0x0;
    }
    if (-500 < iVar1) {
      memset(piVar3,0,(uVar4 & 0xffffffff) << 2);
    }
    (p->vTravIds).nSize = iVar8;
  }
  iVar1 = p->nTravIds;
  p->nTravIds = iVar1 + 1;
  if (0x3ffffffe < iVar1) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  if (bVar2) {
    lVar7 = 0;
    do {
      Abc_SclPerformBuffering_rec
                ((Abc_Obj_t *)pVVar5->pArray[lVar7],DegreeR,Degree,fUseInvs,fVerbose);
      lVar7 = lVar7 + 1;
      pVVar5 = p->vCis;
    } while (lVar7 < pVVar5->nSize);
    if (0 < pVVar5->nSize) {
      uVar6 = 0;
      uVar4 = (ulong)(uint)p_00->nSize;
      if (p_00->nSize < 1) {
        uVar4 = uVar6;
      }
      do {
        if (uVar4 == uVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        *(uint *)((long)pVVar5->pArray[uVar6] + 0x14) =
             *(uint *)((long)pVVar5->pArray[uVar6] + 0x14) & 0xfff | p_00->pArray[uVar6] << 0xc;
        uVar6 = uVar6 + 1;
        pVVar5 = p->vCis;
      } while ((long)uVar6 < (long)pVVar5->nSize);
    }
  }
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar5->pArray[lVar7];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        Abc_ObjLevelNew(pObj);
        pVVar5 = p->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (p->vPhases != (Vec_Int_t *)0x0) {
    Vec_IntFillExtra(p->vPhases,p->vObjs->nSize,Fill);
  }
  p_01 = Abc_NtkDupDfs(p);
  Abc_SclCheckNtk(p_01,fVerbose);
  return p_01;
}

Assistant:

Abc_Ntk_t * Abc_SclPerformBuffering( Abc_Ntk_t * p, int DegreeR, int Degree, int fUseInvs, int fVerbose )
{
    Vec_Int_t * vCiLevs;
    Abc_Ntk_t * pNew;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkHasMapping(p) );
    if ( fUseInvs )
    {
        printf( "Warning!!! Using inverters instead of buffers.\n" );
        if ( p->vPhases == NULL )
            printf( "The phases are not given. The result will not verify.\n" );
    }
    // remember CI levels
    vCiLevs = Vec_IntAlloc( Abc_NtkCiNum(p) );
    Abc_NtkForEachCi( p, pObj, i )
        Vec_IntPush( vCiLevs, Abc_ObjLevel(pObj) );
    // perform buffering
    Abc_NtkIncrementTravId( p );        
    Abc_NtkForEachCi( p, pObj, i )
        Abc_SclPerformBuffering_rec( pObj, DegreeR, Degree, fUseInvs, fVerbose );
    // recompute logic levels
    Abc_NtkForEachCi( p, pObj, i )
        pObj->Level = Vec_IntEntry( vCiLevs, i );
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjLevelNew( pObj );
    Vec_IntFree( vCiLevs );
    // if phases are present
    if ( p->vPhases )
        Vec_IntFillExtra( p->vPhases, Abc_NtkObjNumMax(p), 0 );
    // duplication in topo order
    pNew = Abc_NtkDupDfs( p );
    Abc_SclCheckNtk( pNew, fVerbose );
//    Abc_NtkDelete( pNew );
    return pNew;
}